

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void tmat_to_dense(double *tmat,double *dmat,size_t n,double fill_diag)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long local_60;
  
  if ((n & 1) == 0) {
    local_60 = (n - 1) * (n >> 1);
  }
  else {
    local_60 = (n - 1 >> 1) * n;
  }
  uVar4 = n - 1;
  if (uVar4 != 0) {
    uVar10 = (n - 2) * uVar4;
    lVar5 = n * -2 + 4;
    pdVar8 = dmat;
    uVar6 = 0;
    do {
      uVar1 = uVar6 + 1;
      if (uVar1 < n) {
        lVar14 = 1;
        lVar7 = local_60 + -2;
        sVar9 = n;
        uVar11 = uVar10;
        lVar12 = lVar5;
        uVar15 = uVar1;
        do {
          if (uVar6 < uVar6 + lVar14) {
            lVar13 = (local_60 - uVar6) + ~(((n - uVar6) + -1) * (n - uVar6) >> 1) + uVar15;
          }
          else {
            lVar13 = lVar7 - (uVar11 >> 1);
          }
          dVar2 = tmat[lVar13];
          pdVar8[lVar14] = dVar2;
          pdVar8[sVar9] = dVar2;
          uVar15 = uVar15 + 1;
          lVar7 = lVar7 + -1;
          uVar11 = uVar11 + lVar12;
          lVar12 = lVar12 + 2;
          lVar13 = uVar6 + lVar14;
          lVar14 = lVar14 + 1;
          sVar9 = sVar9 + n;
        } while (lVar13 + 1U < n);
      }
      uVar10 = uVar10 + lVar5;
      lVar5 = lVar5 + 2;
      pdVar8 = pdVar8 + n + 1;
      uVar6 = uVar1;
    } while (uVar1 != uVar4);
  }
  auVar3 = _DAT_0036b1f0;
  if (n != 0) {
    uVar6 = n + 1 & 0xfffffffffffffffe;
    auVar16._8_4_ = (int)uVar4;
    auVar16._0_8_ = uVar4;
    auVar16._12_4_ = (int)(uVar4 >> 0x20);
    auVar16 = auVar16 ^ _DAT_0036b1f0;
    auVar17 = _DAT_0036b1e0;
    do {
      auVar18 = auVar17 ^ auVar3;
      if ((bool)(~(auVar18._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar18._0_4_ ||
                  auVar16._4_4_ < auVar18._4_4_) & 1)) {
        *dmat = fill_diag;
      }
      if ((auVar18._12_4_ != auVar16._12_4_ || auVar18._8_4_ <= auVar16._8_4_) &&
          auVar18._12_4_ <= auVar16._12_4_) {
        dmat[n + 1] = fill_diag;
      }
      lVar5 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar5 + 2;
      dmat = dmat + n * 2 + 2;
      uVar6 = uVar6 - 2;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void tmat_to_dense(double *restrict tmat, double *restrict dmat, size_t n, double fill_diag)
{
    size_t ncomb = calc_ncomb(n);
    for (size_t i = 0; i < (n-1); i++)
    {
        for (size_t j = i + 1; j < n; j++)
        {
            // dmat[i + j * n] = dmat[j + i * n] = tmat[i * (n - (i+1)/2) + j - i - 1];
            dmat[i + j * n] = dmat[j + i * n] = tmat[ix_comb(i, j, n, ncomb)];
        }
    }
    for (size_t i = 0; i < n; i++)
        dmat[i + i * n] = fill_diag;
}